

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O2

bool __thiscall
draco::DecoderBuffer::BitDecoder::GetBits(BitDecoder *this,uint32_t nbits,uint32_t *x)

{
  int iVar1;
  uint32_t bit;
  uint32_t uVar2;
  uint uVar3;
  
  if (nbits < 0x21) {
    uVar3 = 0;
    for (uVar2 = 0; nbits != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = GetBit(this);
      uVar3 = uVar3 | iVar1 << ((byte)uVar2 & 0x1f);
    }
    *x = uVar3;
  }
  return nbits < 0x21;
}

Assistant:

inline bool GetBits(uint32_t nbits, uint32_t *x) {
      if (nbits > 32) {
        return false;
      }
      uint32_t value = 0;
      for (uint32_t bit = 0; bit < nbits; ++bit) {
        value |= GetBit() << bit;
      }
      *x = value;
      return true;
    }